

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

bool density_tests::detail::
     PutString<density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
     ::put(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
           *queue,EasyRandom *i_rand)

{
  int32_t iVar1;
  string str;
  allocator local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_30,"hello world!",&local_31);
  iVar1 = EasyRandom::get_bool(i_rand);
  if (iVar1 == 0) {
    density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>::
    reentrant_emplace<std::__cxx11::string,std::__cxx11::string&>
              ((heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>
                *)queue,&local_30);
  }
  else {
    density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>::
    emplace<std::__cxx11::string,std::__cxx11::string&>
              ((heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>
                *)queue,&local_30);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return true;
}

Assistant:

static bool put(QUEUE & queue, EasyRandom & i_rand)
            {
                std::string str("hello world!");
                if (i_rand.get_bool())
                    queue.push(str);
                else
                    queue.reentrant_push(str);
                return true;
            }